

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readline.c
# Opt level: O2

wchar_t rl_insert(wchar_t count,wchar_t c)

{
  char arr [2];
  char local_1a [2];
  
  if ((h == (History *)0x0) || (e == (EditLine *)0x0)) {
    rl_initialize();
  }
  local_1a[1] = 0;
  local_1a[0] = (char)c;
  for (; L'\0' < count; count = count + L'\xffffffff') {
    el_push(e,local_1a);
  }
  return L'\0';
}

Assistant:

int
rl_insert(int count, int c)
{
	char arr[2];

	if (h == NULL || e == NULL)
		rl_initialize();

	/* XXX - int -> char conversion can lose on multichars */
	arr[0] = (char)c;
	arr[1] = '\0';

	for (; count > 0; count--)
		el_push(e, arr);

	return 0;
}